

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

uint64_t __thiscall leveldb::Table::ApproximateOffsetOf(Table *this,Slice *key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Iterator *pIVar4;
  undefined4 extraout_var;
  Status s;
  Slice input;
  BlockHandle handle;
  uint64_t result;
  Iterator *index_iter;
  Slice *key_local;
  Table *this_local;
  
  pIVar4 = Block::NewIterator(this->rep_->index_block,(this->rep_->options).comparator);
  (*pIVar4->_vptr_Iterator[5])(pIVar4,key);
  uVar2 = (*pIVar4->_vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    handle.size_ = BlockHandle::offset(&this->rep_->metaindex_handle);
  }
  else {
    BlockHandle::BlockHandle((BlockHandle *)&input.size_);
    iVar3 = (*pIVar4->_vptr_Iterator[9])();
    s.state_ = (char *)CONCAT44(extraout_var,iVar3);
    BlockHandle::DecodeFrom((BlockHandle *)&stack0xffffffffffffffb0,(Slice *)&input.size_);
    bVar1 = Status::ok((Status *)&stack0xffffffffffffffb0);
    if (bVar1) {
      handle.size_ = BlockHandle::offset((BlockHandle *)&input.size_);
    }
    else {
      handle.size_ = BlockHandle::offset(&this->rep_->metaindex_handle);
    }
    Status::~Status((Status *)&stack0xffffffffffffffb0);
  }
  if (pIVar4 != (Iterator *)0x0) {
    (*pIVar4->_vptr_Iterator[1])();
  }
  return handle.size_;
}

Assistant:

uint64_t Table::ApproximateOffsetOf(const Slice& key) const {
  Iterator* index_iter =
      rep_->index_block->NewIterator(rep_->options.comparator);
  index_iter->Seek(key);
  uint64_t result;
  if (index_iter->Valid()) {
    BlockHandle handle;
    Slice input = index_iter->value();
    Status s = handle.DecodeFrom(&input);
    if (s.ok()) {
      result = handle.offset();
    } else {
      // Strange: we can't decode the block handle in the index block.
      // We'll just return the offset of the metaindex block, which is
      // close to the whole file size for this case.
      result = rep_->metaindex_handle.offset();
    }
  } else {
    // key is past the last key in the file.  Approximate the offset
    // by returning the offset of the metaindex block (which is
    // right near the end of the file).
    result = rep_->metaindex_handle.offset();
  }
  delete index_iter;
  return result;
}